

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined1 uVar1;
  U32 UVar2;
  U32 UVar3;
  undefined8 uVar4;
  seqDef *psVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  int iVar7;
  size_t err_code_1;
  size_t sVar8;
  U32 UVar9;
  ulong uVar10;
  U32 *pUVar11;
  uint uVar12;
  size_t err_code;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  BYTE *op;
  ulong uVar17;
  U32 UVar18;
  uint uVar19;
  bool bVar20;
  int in_stack_ffffffffffffff90;
  repcodes_t dRepOriginal;
  
  UVar2 = dRep->rep[2];
  uVar4 = *(undefined8 *)dRep->rep;
  if ((isPartition != 0) &&
     (uVar10 = (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3,
     (int)uVar10 != 0)) {
    uVar14 = 0;
    do {
      psVar5 = seqStore->sequencesStart;
      bVar20 = psVar5[uVar14].litLength == 0;
      UVar3 = psVar5[uVar14].offset;
      uVar16 = UVar3 - 1;
      if (uVar16 < 3) {
        uVar13 = uVar16 + bVar20;
        if (uVar13 == 3) {
          UVar18 = dRep->rep[0] - 1;
          UVar9 = cRep->rep[0] - 1;
        }
        else {
          UVar18 = dRep->rep[uVar13];
          UVar9 = cRep->rep[uVar13];
        }
        if (UVar18 != UVar9) {
          psVar5[uVar14].offset = UVar9 + 3;
        }
      }
      uVar13 = psVar5[uVar14].offset - 1;
      uVar12 = (uint)bVar20;
      if (uVar13 < 3) {
        uVar13 = uVar13 + uVar12;
        if (uVar13 == 0) {
          uVar15 = *(ulong *)dRep->rep;
          uVar17 = uVar15 >> 0x20;
          pUVar11 = dRep->rep + 2;
        }
        else {
          if (uVar13 == 3) {
            uVar19 = dRep->rep[0] - 1;
          }
          else {
            uVar19 = dRep->rep[uVar13];
          }
          uVar15 = (ulong)uVar19;
          uVar17 = (ulong)dRep->rep[0];
          pUVar11 = dRep->rep + (ulong)(uVar13 == 1) + 1;
        }
      }
      else {
        uVar17 = (ulong)dRep->rep[0];
        uVar15 = (ulong)(psVar5[uVar14].offset - 3);
        pUVar11 = dRep->rep + 1;
      }
      UVar18 = *pUVar11;
      *(ulong *)dRep->rep = uVar15 & 0xffffffff | uVar17 << 0x20;
      dRep->rep[2] = UVar18;
      if (uVar16 < 3) {
        uVar16 = uVar16 + uVar12;
        if (uVar16 == 0) {
          uVar15 = *(ulong *)cRep->rep;
          uVar17 = uVar15 >> 0x20;
          pUVar11 = cRep->rep + 2;
        }
        else {
          if (uVar16 == 3) {
            uVar13 = cRep->rep[0] - 1;
          }
          else {
            uVar13 = cRep->rep[uVar16];
          }
          uVar15 = (ulong)uVar13;
          uVar17 = (ulong)cRep->rep[0];
          pUVar11 = cRep->rep + (ulong)(uVar16 == 1) + 1;
        }
      }
      else {
        uVar17 = (ulong)cRep->rep[0];
        uVar15 = (ulong)(UVar3 - 3);
        pUVar11 = cRep->rep + 1;
      }
      UVar3 = *pUVar11;
      *(ulong *)cRep->rep = uVar15 & 0xffffffff | uVar17 << 0x20;
      cRep->rep[2] = UVar3;
      uVar14 = uVar14 + 1;
    } while ((uVar10 & 0xffffffff) != uVar14);
  }
  uVar10 = ZSTD_entropyCompressSeqStore
                     (seqStore,&((zc->blockState).prevCBlock)->entropy,
                      &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                      (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                      (ulong)(uint)zc->bmi2,in_stack_ffffffffffffff90);
  if (uVar10 < 0xffffffffffffff89) {
    sVar8 = uVar10;
    if ((uVar10 < 0x19) && (zc->isFirstBlock == 0)) {
      iVar7 = ZSTD_isRLE((BYTE *)src,srcSize);
      sVar8 = 1;
      if (iVar7 == 0) {
        sVar8 = uVar10;
      }
    }
    if ((zc->seqCollector).collectSequences == 0) {
      pZVar6 = (zc->blockState).prevCBlock;
      if ((pZVar6->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (pZVar6->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      if (sVar8 == 1) {
        if (dstCapacity < 4) {
          return 0xffffffffffffffba;
        }
        uVar1 = *src;
        iVar7 = lastBlock + (int)srcSize * 8 + 2;
        *(short *)dst = (short)iVar7;
        *(char *)((long)dst + 2) = (char)((uint)iVar7 >> 0x10);
        *(undefined1 *)((long)dst + 3) = uVar1;
        uVar10 = 4;
      }
      else {
        if (sVar8 != 0) {
          (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
          (zc->blockState).nextCBlock = pZVar6;
          iVar7 = lastBlock + (int)sVar8 * 8 + 4;
          *(short *)dst = (short)iVar7;
          *(char *)((long)dst + 2) = (char)((uint)iVar7 >> 0x10);
          return sVar8 + 3;
        }
        uVar10 = 0xffffffffffffffba;
        if (srcSize + 3 <= dstCapacity) {
          iVar7 = lastBlock + (int)srcSize * 8;
          *(short *)dst = (short)iVar7;
          *(char *)((long)dst + 2) = (char)((uint)iVar7 >> 0x10);
          memcpy((void *)((long)dst + 3),src,srcSize);
          uVar10 = srcSize + 3;
        }
        if (0xffffffffffffff88 < uVar10) {
          return uVar10;
        }
      }
      dRep->rep[2] = UVar2;
      *(undefined8 *)dRep->rep = uVar4;
    }
    else {
      ZSTD_copyBlockSequences(zc);
      pZVar6 = (zc->blockState).prevCBlock;
      (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
      (zc->blockState).nextCBlock = pZVar6;
      uVar10 = 0;
    }
  }
  return uVar10;
}

Assistant:

static size_t ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc, seqStore_t* const seqStore,
                                                repcodes_t* const dRep, repcodes_t* const cRep,
                                                void* dst, size_t dstCapacity,
                                                const void* src, size_t srcSize,
                                                U32 lastBlock, U32 isPartition) {
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }
    return cSize;
}